

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall slang::SmallVector<slang::parsing::Trivia,_2UL>::SmallVector(void *param_1)

{
  size_type in_stack_ffffffffffffffd8;
  SmallVectorBase<slang::parsing::Trivia> *in_stack_ffffffffffffffe0;
  
  SmallVectorBase<slang::parsing::Trivia>::SmallVectorBase
            ((SmallVectorBase<slang::parsing::Trivia> *)param_1,2);
  SmallVectorBase<slang::parsing::Trivia>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }